

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O1

void __thiscall CholeskyFactor::solveLT(CholeskyFactor *this,QpVector *rhs)

{
  long lVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  long lVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  
  lVar6 = (long)rhs->dim;
  if (0 < lVar6) {
    pdVar3 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->current_k_max;
    pdVar4 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = pdVar4 + (lVar6 + -1) * (long)iVar2 + -1;
    lVar8 = lVar6;
    do {
      dVar9 = 0.0;
      for (lVar1 = lVar6; lVar8 < lVar1; lVar1 = lVar1 + -1) {
        dVar9 = dVar9 + pdVar3[lVar1 + -1] * pdVar7[lVar1];
      }
      lVar1 = lVar8 + -1;
      pdVar3[lVar1] = (pdVar3[lVar1] - dVar9) / pdVar4[(iVar2 + 1) * (int)lVar1];
      pdVar7 = pdVar7 + -(long)iVar2;
      bVar5 = 1 < lVar8;
      lVar8 = lVar1;
    } while (bVar5);
  }
  return;
}

Assistant:

void solveLT(QpVector& rhs) {
    for (HighsInt i = rhs.dim - 1; i >= 0; i--) {
      double sum = 0.0;
      for (HighsInt j = rhs.dim - 1; j > i; j--) {
        sum += rhs.value[j] * L[i * current_k_max + j];
      }
      rhs.value[i] = (rhs.value[i] - sum) / L[i * current_k_max + i];
    }
  }